

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float64 soft_f64_mul(float64 a,float64 b,float_status *status)

{
  ulong uVar1;
  FloatParts a_00;
  uint64_t a_01;
  _Bool _Var2;
  float64 fVar3;
  FloatParts FVar4;
  FloatParts pr;
  FloatParts pb;
  FloatParts pa;
  float_status *status_local;
  float64 b_local;
  float64 a_local;
  uint64_t uStack_e0;
  int exp;
  uint64_t lo;
  uint64_t hi;
  float_status *pfStack_c8;
  _Bool sign;
  uint64_t local_c0;
  int local_b8;
  FloatClass FStack_b4;
  _Bool _Stack_b3;
  undefined2 uStack_b2;
  ulong local_b0;
  int local_a8;
  FloatClass FStack_a4;
  _Bool _Stack_a3;
  undefined2 uStack_a2;
  FloatParts local_a0;
  FloatParts local_90;
  float_status *local_80;
  uint64_t local_78;
  undefined8 local_70;
  FloatParts local_68;
  float_status *local_58;
  float64 local_50;
  FloatParts local_48;
  FloatParts local_38;
  float_status *local_28;
  float64 local_20;
  FloatParts local_18;
  
  local_28 = status;
  local_20 = a;
  local_38 = float64_unpack_raw(a);
  FVar4 = sf_canonicalize(local_38,&float64_params,local_28);
  local_18.frac = FVar4.frac;
  a_01 = local_18.frac;
  local_58 = status;
  local_50 = b;
  local_18 = FVar4;
  local_68 = float64_unpack_raw(b);
  local_48 = sf_canonicalize(local_68,&float64_params,local_58);
  local_b0 = a_01;
  local_a8 = FVar4.exp;
  FStack_a4 = FVar4.cls;
  _Stack_a3 = FVar4.sign;
  uStack_a2 = FVar4._14_2_;
  local_c0 = local_48.frac;
  local_b8 = local_48.exp;
  FStack_b4 = local_48.cls;
  _Stack_b3 = local_48.sign;
  uStack_b2 = local_48._14_2_;
  hi._7_1_ = (_Stack_a3 & 1U) != (_Stack_b3 & 1U);
  pfStack_c8 = status;
  if ((FStack_a4 == float_class_normal) && (FStack_b4 == float_class_normal)) {
    a_local._4_4_ = local_a8 + local_b8;
    mul64To128(a_01,local_48.frac,&lo,&stack0xffffffffffffff20);
    shift128RightJamming(lo,uStack_e0,0x3e,&lo,&stack0xffffffffffffff20);
    if ((uStack_e0 & 0x8000000000000000) != 0) {
      shift64RightJamming(uStack_e0,1,&stack0xffffffffffffff20);
      a_local._4_4_ = a_local._4_4_ + 1;
    }
    local_a8 = a_local._4_4_;
    _Stack_a3 = (_Bool)(hi._7_1_ & 1);
    local_b0 = uStack_e0;
    uVar1 = CONCAT26(uStack_a2,CONCAT15(hi._7_1_,CONCAT14(FStack_a4,a_local._4_4_))) &
            0xffff01ffffffffff;
    local_a0.exp = (int)uVar1;
    local_a0.cls = (char)(uVar1 >> 0x20);
    local_a0.sign = (_Bool)(char)(uVar1 >> 0x28);
    local_a0._14_2_ = (short)(uVar1 >> 0x30);
    local_a0.frac = uStack_e0;
  }
  else {
    _Var2 = is_nan(FStack_a4);
    if (!_Var2) {
      _Var2 = is_nan(FStack_b4);
      if (!_Var2) {
        if (((FStack_a4 == float_class_inf) && (FStack_b4 == float_class_zero)) ||
           ((FStack_a4 == float_class_zero && (FStack_b4 == float_class_inf)))) {
          pfStack_c8->float_exception_flags = pfStack_c8->float_exception_flags | 1;
          local_a0 = parts_default_nan(pfStack_c8);
        }
        else if ((FStack_a4 == float_class_inf) || (FStack_a4 == float_class_zero)) {
          _Stack_a3 = (_Bool)(hi._7_1_ & 1);
          uVar1 = CONCAT26(uStack_a2,CONCAT15(hi._7_1_,CONCAT14(FStack_a4,local_a8))) &
                  0xffff01ffffffffff;
          local_a0.exp = (int)uVar1;
          local_a0.cls = (char)(uVar1 >> 0x20);
          local_a0.sign = (_Bool)(char)(uVar1 >> 0x28);
          local_a0._14_2_ = (short)(uVar1 >> 0x30);
          local_a0.frac = local_b0;
        }
        else {
          if ((FStack_b4 != float_class_inf) && (FStack_b4 != float_class_zero)) {
            g_assertion_message_expr
                      ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                       ,0x4e6,(char *)0x0);
          }
          _Stack_b3 = (_Bool)(hi._7_1_ & 1);
          uVar1 = CONCAT26(uStack_b2,CONCAT15(hi._7_1_,CONCAT14(FStack_b4,local_b8))) &
                  0xffff01ffffffffff;
          local_a0.exp = (int)uVar1;
          local_a0.cls = (char)(uVar1 >> 0x20);
          local_a0.sign = (_Bool)(char)(uVar1 >> 0x28);
          local_a0._14_2_ = (short)(uVar1 >> 0x30);
          local_a0.frac = local_c0;
        }
        goto LAB_012b6a3e;
      }
    }
    a_00.exp = local_a8;
    a_00.frac = local_b0;
    a_00.cls = FStack_a4;
    a_00.sign = _Stack_a3;
    a_00._14_2_ = uStack_a2;
    FVar4.exp = local_b8;
    FVar4.frac = local_c0;
    FVar4.cls = FStack_b4;
    FVar4.sign = _Stack_b3;
    FVar4._14_2_ = uStack_b2;
    local_a0 = pick_nan(a_00,FVar4,pfStack_c8);
  }
LAB_012b6a3e:
  FVar4 = local_a0;
  local_78 = local_a0.frac;
  local_70._0_4_ = local_a0.exp;
  local_70._4_1_ = local_a0.cls;
  local_70._5_1_ = local_a0.sign;
  local_70._6_2_ = local_a0._14_2_;
  local_a0 = FVar4;
  local_80 = status;
  local_90 = round_canonical(FVar4,status,&float64_params);
  fVar3 = float64_pack_raw(local_90);
  return fVar3;
}

Assistant:

static float64 QEMU_SOFTFLOAT_ATTR
soft_f64_mul(float64 a, float64 b, float_status *status)
{
    FloatParts pa = float64_unpack_canonical(a, status);
    FloatParts pb = float64_unpack_canonical(b, status);
    FloatParts pr = mul_floats(pa, pb, status);

    return float64_round_pack_canonical(pr, status);
}